

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msg32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  bool bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  int iVar73;
  uint64_t mask0;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  uint uVar80;
  char cVar81;
  ulong uVar82;
  uint uVar83;
  uint uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  bool bVar96;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar non;
  uchar nonce32 [32];
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  secp256k1_scalar n;
  int overflow;
  secp256k1_ge r_1;
  uint64_t l [8];
  uchar b [32];
  secp256k1_scalar local_2a8;
  secp256k1_context *local_280;
  ulong local_278;
  uint local_270;
  int local_26c;
  secp256k1_scalar local_268;
  uchar *local_240;
  secp256k1_scalar local_238;
  secp256k1_ecdsa_signature *local_218;
  uchar *local_210;
  void *local_208;
  secp256k1_nonce_function local_200;
  uchar local_1f8 [32];
  secp256k1_scalar local_1d8;
  secp256k1_scalar local_1b8;
  secp256k1_scalar local_198;
  secp256k1_gej local_178;
  secp256k1_ge local_f8;
  uint64_t local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [16];
  uchar local_58 [40];
  
  local_240 = seckey;
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    local_280 = ctx;
    secp256k1_ecdsa_sign_cold_1();
    uVar80 = 0;
  }
  else {
    local_280 = (secp256k1_context *)&ctx->ecmult_gen_ctx;
    local_268.d[0] = 0;
    local_268.d[1] = 0;
    local_268.d[2] = 0;
    local_268.d[3] = 0;
    local_2a8.d[0] = 0;
    local_2a8.d[1] = 0;
    local_2a8.d[2] = 0;
    local_2a8.d[3] = 0;
    local_200 = nonce_function_rfc6979;
    if (noncefp != (secp256k1_nonce_function)0x0) {
      local_200 = noncefp;
    }
    local_218 = signature;
    secp256k1_scalar_set_b32(&local_1b8,seckey,(int *)&local_178);
    local_270 = (uint)(((local_1b8.d[2] != 0 || local_1b8.d[3] != 0) ||
                       (local_1b8.d[1] != 0 || local_1b8.d[0] != 0)) && (int)local_178.x.n[0] == 0);
    uVar74 = (ulong)(local_270 ^ 1) - 1;
    local_1b8.d[0] = local_1b8.d[0] & uVar74 | (ulong)(local_270 ^ 1);
    local_1b8.d[1] = local_1b8.d[1] & uVar74;
    local_1b8.d[2] = local_1b8.d[2] & uVar74;
    local_1b8.d[3] = uVar74 & local_1b8.d[3];
    local_278 = 0;
    secp256k1_scalar_set_b32(&local_1d8,msg32,(int *)0x0);
    local_210 = msg32;
    local_208 = noncedata;
    do {
      cVar81 = '\0';
      iVar73 = (*local_200)(local_1f8,msg32,local_240,(uchar *)0x0,noncedata,(uint)local_278);
      bVar96 = iVar73 != 0;
      uVar80 = (uint)bVar96;
      if (bVar96) {
        secp256k1_scalar_set_b32(&local_238,local_1f8,(int *)&local_178);
        uVar83 = (uint)bVar96;
        if (((int)local_178.x.n[0] == 0) &&
           (((local_238.d[1] != 0 || local_238.d[0] != 0) || local_238.d[2] != 0) ||
            local_238.d[3] != 0)) {
          uVar82 = 0;
          local_26c = 0;
          secp256k1_ecmult_gen((secp256k1_ecmult_gen_context *)local_280,&local_178,&local_238);
          secp256k1_ge_set_gej(&local_f8,&local_178);
          secp256k1_fe_normalize(&local_f8.x);
          secp256k1_fe_normalize(&local_f8.y);
          secp256k1_fe_get_b32(local_58,&local_f8.x);
          secp256k1_scalar_set_b32(&local_268,local_58,&local_26c);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_268.d[0];
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_1b8.d[0];
          uVar75 = SUB168(auVar1 * auVar33,8);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar75;
          local_98 = SUB168(auVar1 * auVar33,0);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_268.d[0];
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_1b8.d[1];
          auVar2 = auVar2 * auVar34;
          uVar85 = SUB168(auVar2 + auVar67,0);
          uVar90 = SUB168(auVar2 + auVar67,8);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_268.d[1];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_1b8.d[0];
          uVar76 = SUB168(auVar3 * auVar35,8);
          uVar74 = SUB168(auVar3 * auVar35,0);
          local_90 = uVar85 + uVar74;
          uVar74 = (ulong)CARRY8(uVar85,uVar74);
          uVar85 = uVar90 + uVar76;
          uVar91 = uVar85 + uVar74;
          uVar92 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar75,auVar2._0_8_)) +
                   (ulong)(CARRY8(uVar90,uVar76) || CARRY8(uVar85,uVar74));
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_268.d[0];
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_1b8.d[2];
          uVar77 = SUB168(auVar4 * auVar36,8);
          uVar74 = SUB168(auVar4 * auVar36,0);
          uVar75 = uVar91 + uVar74;
          uVar74 = (ulong)CARRY8(uVar91,uVar74);
          uVar76 = uVar92 + uVar77;
          uVar93 = uVar76 + uVar74;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_268.d[1];
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_1b8.d[1];
          uVar78 = SUB168(auVar5 * auVar37,8);
          uVar85 = SUB168(auVar5 * auVar37,0);
          uVar91 = uVar75 + uVar85;
          uVar85 = (ulong)CARRY8(uVar75,uVar85);
          uVar90 = uVar93 + uVar78;
          uVar94 = uVar90 + uVar85;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_268.d[2];
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_1b8.d[0];
          uVar79 = SUB168(auVar6 * auVar38,8);
          uVar75 = SUB168(auVar6 * auVar38,0);
          local_88 = uVar91 + uVar75;
          uVar75 = (ulong)CARRY8(uVar91,uVar75);
          uVar91 = uVar94 + uVar79;
          uVar95 = uVar91 + uVar75;
          uVar86 = (ulong)(CARRY8(uVar92,uVar77) || CARRY8(uVar76,uVar74)) +
                   (ulong)(CARRY8(uVar93,uVar78) || CARRY8(uVar90,uVar85)) +
                   (ulong)(CARRY8(uVar94,uVar79) || CARRY8(uVar91,uVar75));
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_268.d[0];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_1b8.d[3];
          uVar79 = SUB168(auVar7 * auVar39,8);
          uVar74 = SUB168(auVar7 * auVar39,0);
          uVar75 = uVar95 + uVar74;
          uVar74 = (ulong)CARRY8(uVar95,uVar74);
          uVar90 = uVar86 + uVar79;
          uVar95 = uVar90 + uVar74;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_268.d[1];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = local_1b8.d[2];
          uVar92 = SUB168(auVar8 * auVar40,8);
          uVar85 = SUB168(auVar8 * auVar40,0);
          uVar76 = uVar75 + uVar85;
          uVar85 = (ulong)CARRY8(uVar75,uVar85);
          uVar91 = uVar95 + uVar92;
          uVar87 = uVar91 + uVar85;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_268.d[2];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = local_1b8.d[1];
          uVar93 = SUB168(auVar9 * auVar41,8);
          uVar75 = SUB168(auVar9 * auVar41,0);
          uVar78 = uVar76 + uVar75;
          uVar75 = (ulong)CARRY8(uVar76,uVar75);
          uVar77 = uVar87 + uVar93;
          uVar88 = uVar77 + uVar75;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_268.d[3];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = local_1b8.d[0];
          uVar94 = SUB168(auVar10 * auVar42,8);
          uVar76 = SUB168(auVar10 * auVar42,0);
          local_80 = uVar78 + uVar76;
          uVar76 = (ulong)CARRY8(uVar78,uVar76);
          uVar78 = uVar88 + uVar94;
          uVar89 = uVar78 + uVar76;
          uVar92 = (ulong)(CARRY8(uVar86,uVar79) || CARRY8(uVar90,uVar74)) +
                   (ulong)(CARRY8(uVar95,uVar92) || CARRY8(uVar91,uVar85)) +
                   (ulong)(CARRY8(uVar87,uVar93) || CARRY8(uVar77,uVar75)) +
                   (ulong)(CARRY8(uVar88,uVar94) || CARRY8(uVar78,uVar76));
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_268.d[1];
          auVar43._8_8_ = 0;
          auVar43._0_8_ = local_1b8.d[3];
          uVar77 = SUB168(auVar11 * auVar43,8);
          uVar74 = SUB168(auVar11 * auVar43,0);
          uVar75 = uVar89 + uVar74;
          uVar74 = (ulong)CARRY8(uVar89,uVar74);
          uVar76 = uVar92 + uVar77;
          uVar93 = uVar76 + uVar74;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_268.d[2];
          auVar44._8_8_ = 0;
          auVar44._0_8_ = local_1b8.d[2];
          uVar78 = SUB168(auVar12 * auVar44,8);
          uVar85 = SUB168(auVar12 * auVar44,0);
          uVar91 = uVar75 + uVar85;
          uVar85 = (ulong)CARRY8(uVar75,uVar85);
          uVar90 = uVar93 + uVar78;
          uVar94 = uVar90 + uVar85;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_268.d[3];
          auVar45._8_8_ = 0;
          auVar45._0_8_ = local_1b8.d[1];
          uVar79 = SUB168(auVar13 * auVar45,8);
          uVar75 = SUB168(auVar13 * auVar45,0);
          local_78 = uVar91 + uVar75;
          uVar75 = (ulong)CARRY8(uVar91,uVar75);
          uVar91 = uVar94 + uVar79;
          uVar86 = uVar91 + uVar75;
          uVar77 = (ulong)(CARRY8(uVar92,uVar77) || CARRY8(uVar76,uVar74)) +
                   (ulong)(CARRY8(uVar93,uVar78) || CARRY8(uVar90,uVar85)) +
                   (ulong)(CARRY8(uVar94,uVar79) || CARRY8(uVar91,uVar75));
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_268.d[2];
          auVar46._8_8_ = 0;
          auVar46._0_8_ = local_1b8.d[3];
          uVar90 = SUB168(auVar14 * auVar46,8);
          uVar74 = SUB168(auVar14 * auVar46,0);
          uVar76 = uVar86 + uVar74;
          uVar74 = (ulong)CARRY8(uVar86,uVar74);
          uVar75 = uVar77 + uVar90;
          uVar78 = uVar75 + uVar74;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_268.d[3];
          auVar47._8_8_ = 0;
          auVar47._0_8_ = local_1b8.d[2];
          uVar91 = SUB168(auVar15 * auVar47,8);
          uVar85 = SUB168(auVar15 * auVar47,0);
          local_70 = uVar76 + uVar85;
          uVar85 = (ulong)CARRY8(uVar76,uVar85);
          uVar76 = uVar78 + uVar91;
          local_68._8_8_ =
               (ulong)(CARRY8(uVar77,uVar90) || CARRY8(uVar75,uVar74)) +
               (ulong)(CARRY8(uVar78,uVar91) || CARRY8(uVar76,uVar85));
          local_68._0_8_ = uVar76 + uVar85;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_268.d[3];
          auVar48._8_8_ = 0;
          auVar48._0_8_ = local_1b8.d[3];
          local_68 = auVar16 * auVar48 + local_68;
          secp256k1_scalar_reduce_512(&local_198,&local_98);
          secp256k1_scalar_add(&local_198,&local_198,&local_1d8);
          secp256k1_scalar_inverse(&local_2a8,&local_238);
          msg32 = local_210;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_2a8.d[0];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = local_198.d[0];
          uVar75 = SUB168(auVar17 * auVar49,8);
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar75;
          local_98 = SUB168(auVar17 * auVar49,0);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_2a8.d[0];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_198.d[1];
          auVar18 = auVar18 * auVar50;
          uVar85 = SUB168(auVar18 + auVar68,0);
          uVar90 = SUB168(auVar18 + auVar68,8);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_2a8.d[1];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = local_198.d[0];
          uVar76 = SUB168(auVar19 * auVar51,8);
          uVar74 = SUB168(auVar19 * auVar51,0);
          local_90 = uVar85 + uVar74;
          uVar74 = (ulong)CARRY8(uVar85,uVar74);
          uVar85 = uVar90 + uVar76;
          uVar91 = uVar85 + uVar74;
          uVar92 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar75,auVar18._0_8_)) +
                   (ulong)(CARRY8(uVar90,uVar76) || CARRY8(uVar85,uVar74));
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_2a8.d[0];
          auVar52._8_8_ = 0;
          auVar52._0_8_ = local_198.d[2];
          uVar77 = SUB168(auVar20 * auVar52,8);
          uVar74 = SUB168(auVar20 * auVar52,0);
          uVar75 = uVar91 + uVar74;
          uVar74 = (ulong)CARRY8(uVar91,uVar74);
          uVar76 = uVar92 + uVar77;
          uVar93 = uVar76 + uVar74;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_2a8.d[1];
          auVar53._8_8_ = 0;
          auVar53._0_8_ = local_198.d[1];
          uVar78 = SUB168(auVar21 * auVar53,8);
          uVar85 = SUB168(auVar21 * auVar53,0);
          uVar91 = uVar75 + uVar85;
          uVar85 = (ulong)CARRY8(uVar75,uVar85);
          uVar90 = uVar93 + uVar78;
          uVar94 = uVar90 + uVar85;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_2a8.d[2];
          auVar54._8_8_ = 0;
          auVar54._0_8_ = local_198.d[0];
          uVar79 = SUB168(auVar22 * auVar54,8);
          uVar75 = SUB168(auVar22 * auVar54,0);
          local_88 = uVar91 + uVar75;
          uVar75 = (ulong)CARRY8(uVar91,uVar75);
          uVar91 = uVar94 + uVar79;
          uVar95 = uVar91 + uVar75;
          uVar86 = (ulong)(CARRY8(uVar92,uVar77) || CARRY8(uVar76,uVar74)) +
                   (ulong)(CARRY8(uVar93,uVar78) || CARRY8(uVar90,uVar85)) +
                   (ulong)(CARRY8(uVar94,uVar79) || CARRY8(uVar91,uVar75));
          auVar23._8_8_ = 0;
          auVar23._0_8_ = local_2a8.d[0];
          auVar55._8_8_ = 0;
          auVar55._0_8_ = local_198.d[3];
          uVar79 = SUB168(auVar23 * auVar55,8);
          uVar74 = SUB168(auVar23 * auVar55,0);
          uVar75 = uVar95 + uVar74;
          uVar74 = (ulong)CARRY8(uVar95,uVar74);
          uVar90 = uVar86 + uVar79;
          uVar95 = uVar90 + uVar74;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_2a8.d[1];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = local_198.d[2];
          uVar92 = SUB168(auVar24 * auVar56,8);
          uVar85 = SUB168(auVar24 * auVar56,0);
          uVar76 = uVar75 + uVar85;
          uVar85 = (ulong)CARRY8(uVar75,uVar85);
          uVar91 = uVar95 + uVar92;
          uVar87 = uVar91 + uVar85;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_2a8.d[2];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = local_198.d[1];
          uVar93 = SUB168(auVar25 * auVar57,8);
          uVar75 = SUB168(auVar25 * auVar57,0);
          uVar78 = uVar76 + uVar75;
          uVar75 = (ulong)CARRY8(uVar76,uVar75);
          uVar77 = uVar87 + uVar93;
          uVar88 = uVar77 + uVar75;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = local_2a8.d[3];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = local_198.d[0];
          uVar94 = SUB168(auVar26 * auVar58,8);
          uVar76 = SUB168(auVar26 * auVar58,0);
          local_80 = uVar78 + uVar76;
          uVar76 = (ulong)CARRY8(uVar78,uVar76);
          uVar78 = uVar88 + uVar94;
          uVar89 = uVar78 + uVar76;
          uVar92 = (ulong)(CARRY8(uVar86,uVar79) || CARRY8(uVar90,uVar74)) +
                   (ulong)(CARRY8(uVar95,uVar92) || CARRY8(uVar91,uVar85)) +
                   (ulong)(CARRY8(uVar87,uVar93) || CARRY8(uVar77,uVar75)) +
                   (ulong)(CARRY8(uVar88,uVar94) || CARRY8(uVar78,uVar76));
          auVar27._8_8_ = 0;
          auVar27._0_8_ = local_2a8.d[1];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = local_198.d[3];
          uVar77 = SUB168(auVar27 * auVar59,8);
          uVar74 = SUB168(auVar27 * auVar59,0);
          uVar75 = uVar89 + uVar74;
          uVar74 = (ulong)CARRY8(uVar89,uVar74);
          uVar76 = uVar92 + uVar77;
          uVar93 = uVar76 + uVar74;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_2a8.d[2];
          auVar60._8_8_ = 0;
          auVar60._0_8_ = local_198.d[2];
          uVar78 = SUB168(auVar28 * auVar60,8);
          uVar85 = SUB168(auVar28 * auVar60,0);
          uVar91 = uVar75 + uVar85;
          uVar85 = (ulong)CARRY8(uVar75,uVar85);
          uVar90 = uVar93 + uVar78;
          uVar94 = uVar90 + uVar85;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_2a8.d[3];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = local_198.d[1];
          uVar79 = SUB168(auVar29 * auVar61,8);
          uVar75 = SUB168(auVar29 * auVar61,0);
          local_78 = uVar91 + uVar75;
          uVar75 = (ulong)CARRY8(uVar91,uVar75);
          uVar91 = uVar94 + uVar79;
          uVar86 = uVar91 + uVar75;
          uVar77 = (ulong)(CARRY8(uVar92,uVar77) || CARRY8(uVar76,uVar74)) +
                   (ulong)(CARRY8(uVar93,uVar78) || CARRY8(uVar90,uVar85)) +
                   (ulong)(CARRY8(uVar94,uVar79) || CARRY8(uVar91,uVar75));
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_2a8.d[2];
          auVar62._8_8_ = 0;
          auVar62._0_8_ = local_198.d[3];
          uVar90 = SUB168(auVar30 * auVar62,8);
          uVar74 = SUB168(auVar30 * auVar62,0);
          uVar76 = uVar86 + uVar74;
          uVar74 = (ulong)CARRY8(uVar86,uVar74);
          uVar75 = uVar77 + uVar90;
          uVar78 = uVar75 + uVar74;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_2a8.d[3];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = local_198.d[2];
          uVar91 = SUB168(auVar31 * auVar63,8);
          uVar85 = SUB168(auVar31 * auVar63,0);
          local_70 = uVar76 + uVar85;
          uVar85 = (ulong)CARRY8(uVar76,uVar85);
          uVar76 = uVar78 + uVar91;
          auVar65._8_8_ =
               (ulong)(CARRY8(uVar77,uVar90) || CARRY8(uVar75,uVar74)) +
               (ulong)(CARRY8(uVar78,uVar91) || CARRY8(uVar76,uVar85));
          auVar65._0_8_ = uVar76 + uVar85;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_2a8.d[3];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = local_198.d[3];
          local_68 = auVar32 * auVar64 + auVar65;
          secp256k1_scalar_reduce_512(&local_2a8,&local_98);
          uVar83 = -(int)((long)local_2a8.d[3] >> 0x3f);
          uVar84 = uVar83 ^ 1;
          uVar80 = uVar84;
          if (local_2a8.d[2] == 0xffffffffffffffff) {
            uVar80 = 0;
          }
          if (0x5d576e7357a4501c < local_2a8.d[1]) {
            uVar84 = 0;
          }
          uVar84 = (uVar84 | uVar80 | local_2a8.d[3] < 0x7fffffffffffffff) ^ 1;
          uVar80 = 0;
          if (0xdfe92f46681b20a0 < local_2a8.d[0]) {
            uVar80 = uVar84;
          }
          if (0x5d576e7357a4501d < local_2a8.d[1]) {
            uVar80 = uVar84;
          }
          bVar96 = uVar80 != 0;
          bVar69 = uVar83 != 0;
          uVar74 = 0;
          if (bVar96 || bVar69) {
            uVar74 = 0xbfd25e8cd0364142;
          }
          uVar85 = 0;
          if (bVar96 || bVar69) {
            uVar85 = 0xbaaedce6af48a03b;
          }
          uVar75 = 0;
          if (bVar96 || bVar69) {
            uVar75 = 0xfffffffffffffffe;
          }
          uVar77 = -(ulong)(bVar96 || bVar69);
          uVar76 = (ulong)CARRY8(local_2a8.d[0] ^ uVar77,uVar74);
          uVar90 = (local_2a8.d[1] ^ uVar77) + uVar85;
          uVar85 = (ulong)(CARRY8(local_2a8.d[1] ^ uVar77,uVar85) || CARRY8(uVar90,uVar76));
          uVar91 = (local_2a8.d[2] ^ uVar77) + uVar75;
          bVar71 = local_2a8.d[2] == 0;
          bVar72 = local_2a8.d[3] == 0;
          bVar70 = local_2a8.d[1] == 0;
          bVar66 = local_2a8.d[0] == 0;
          local_2a8.d[3] =
               ((uVar77 ^ local_2a8.d[3]) - (ulong)(bVar96 || bVar69)) +
               (ulong)(CARRY8(local_2a8.d[2] ^ uVar77,uVar75) || CARRY8(uVar91,uVar85));
          local_2a8.d[1] = uVar90 + uVar76;
          local_2a8.d[0] = (local_2a8.d[0] ^ uVar77) + uVar74;
          local_2a8.d[2] = uVar91 + uVar85;
          if (((bVar71 && bVar72) && bVar70) && bVar66) {
            local_2a8.d[3] = uVar82;
            local_2a8.d[1] = uVar82;
            local_2a8.d[0] = uVar82;
            local_2a8.d[2] = uVar82;
          }
          local_198.d[0] = 0;
          local_198.d[1] = 0;
          local_198.d[2] = 0;
          local_198.d[3] = 0;
          local_178.x.n[0] = 0;
          local_178.x.n[1] = 0;
          local_178.x.n[2] = 0;
          local_178.x.n[3] = 0;
          local_178.x.n[4] = 0;
          local_178.y.n[0] = 0;
          local_178.y.n[1] = 0;
          local_178.y.n[2] = 0;
          local_178.y.n[3] = 0;
          local_178.y.n[4] = 0;
          local_178.z.n[0] = 0;
          local_178.z.n[1] = 0;
          local_178.z.n[2] = 0;
          local_178.z.n[3]._0_4_ = 0;
          local_178.z.n[3]._4_4_ = 0;
          local_178.z.n[4]._0_4_ = 0;
          local_178._116_8_ = 0;
          local_f8.x.n[0] = 0;
          local_f8.x.n[1] = 0;
          local_f8.x.n[2] = 0;
          local_f8.x.n[3] = 0;
          local_f8.x.n[4] = 0;
          local_f8.y.n[0] = 0;
          local_f8.y.n[1] = 0;
          local_f8.y.n[2] = 0;
          local_f8.y.n[3] = 0;
          local_f8.y.n[4] = 0;
          local_f8.infinity = 0;
          bVar96 = (((local_2a8.d[1] != 0 || local_2a8.d[0] != 0) || local_2a8.d[2] != 0) ||
                   local_2a8.d[3] != 0) &&
                   (((local_268.d[1] != 0 || local_268.d[0] != 0) || local_268.d[2] != 0) ||
                   local_268.d[3] != 0);
          uVar80 = (uint)bVar96;
          noncedata = local_208;
          uVar83 = (uint)bVar96;
          if (((local_2a8.d[1] == 0 && local_2a8.d[0] == 0) && local_2a8.d[2] == 0) &&
              local_2a8.d[3] == 0 ||
              ((local_268.d[1] == 0 && local_268.d[0] == 0) && local_268.d[2] == 0) &&
              local_268.d[3] == 0) goto LAB_0010d3cb;
        }
        else {
LAB_0010d3cb:
          uVar80 = uVar83;
          local_278 = (ulong)((int)local_278 + 1);
          uVar82 = 1;
        }
        cVar81 = (char)uVar82;
      }
    } while (cVar81 != '\0');
    uVar80 = uVar80 & local_270;
    uVar74 = (ulong)(uVar80 ^ 1) - 1;
    *(uint64_t *)(local_218->data + 0x10) = local_268.d[2] & uVar74;
    *(uint64_t *)(local_218->data + 0x18) = local_268.d[3] & uVar74;
    *(uint64_t *)local_218->data = local_268.d[0] & uVar74;
    *(uint64_t *)(local_218->data + 8) = local_268.d[1] & uVar74;
    *(uint64_t *)(local_218->data + 0x20) = local_2a8.d[0] & uVar74;
    *(uint64_t *)(local_218->data + 0x28) = local_2a8.d[1] & uVar74;
    *(uint64_t *)(local_218->data + 0x30) = local_2a8.d[2] & uVar74;
    *(uint64_t *)(local_218->data + 0x38) = local_2a8.d[3] & uVar74;
  }
  return uVar80;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msg32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}